

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

bool __thiscall spirv_cross::CompilerMSL::is_intersection_query(CompilerMSL *this)

{
  SmallVector<spv::Capability,_8UL> *pSVar1;
  Capability *pCVar2;
  
  pSVar1 = Compiler::get_declared_capabilities((Compiler *)this);
  pCVar2 = (pSVar1->super_VectorView<spv::Capability>).ptr;
  pCVar2 = ::std::
           __find_if<spv::Capability_const*,__gnu_cxx::__ops::_Iter_equals_val<spv::Capability_const>>
                     (pCVar2,pCVar2 + (pSVar1->super_VectorView<spv::Capability>).buffer_size);
  return pCVar2 != (pSVar1->super_VectorView<spv::Capability>).ptr +
                   (pSVar1->super_VectorView<spv::Capability>).buffer_size;
}

Assistant:

bool CompilerMSL::is_intersection_query() const
{
	auto &caps = get_declared_capabilities();
	return std::find(caps.begin(), caps.end(), CapabilityRayQueryKHR) != caps.end();
}